

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLCopy.cpp
# Opt level: O0

void __thiscall XPMP2::CSLObj::SetCopyResult(CSLObj *this,bool bResult)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte in_SIL;
  string *in_RDI;
  string *psVar3;
  string local_80 [32];
  string local_60 [48];
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    if (glob < 4) {
      psVar3 = local_60;
      StripXPSysDir(in_RDI);
      uVar1 = std::__cxx11::string::c_str();
      StripXPSysDir(in_RDI);
      uVar2 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
             ,0xc3,"SetCopyResult",logERR,"Copying to \'%s\' failed, falling back to \'%s\'",uVar1,
             uVar2,psVar3);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
    }
    if (glob < 4) {
      uVar1 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
             ,0xc4,"SetCopyResult",logERR,"%s",uVar1);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)(in_RDI + 2));
    *(undefined4 *)&in_RDI[5]._M_string_length = 0;
  }
  else {
    if (glob < 2) {
      StripXPSysDir(in_RDI);
      uVar1 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
             ,0xbf,"SetCopyResult",logINFO,"Created model copy \'%s\' successfully",uVar1);
      std::__cxx11::string::~string(local_30);
    }
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void CSLObj::SetCopyResult (bool bResult)
{
    if (bResult) {                      // success
        LOG_MSG(logINFO, INFO_CPY_SUCCEED, StripXPSysDir(path).c_str());
        pathOrig.clear();               // need no copy any longer
    } else {
        // Copying failed!
        LOG_MSG(logERR, ERR_CPY_FAILED, StripXPSysDir(path).c_str(), StripXPSysDir(pathOrig).c_str());
        LOG_MSG(logERR, "%s", gErrTxt.c_str());
        path = std::move(pathOrig);     // fall back to original
        xpObjState = OLS_UNAVAIL;
    }
}